

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_3_2::jacobiSVD<float>
               (Matrix44<float> *A,Matrix44<float> *U,Vec4<float> *S,Matrix44<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int i_2;
  float (*pafVar7) [4];
  long lVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  long lVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Vec4<float> uCol;
  float local_a8 [4];
  float local_98 [4];
  float *local_88;
  float *local_80;
  Matrix44<float> local_78;
  
  pafVar7 = (float (*) [4])&local_78;
  local_78.x[0]._0_8_ = *(undefined8 *)A->x[0];
  local_78.x[0]._8_8_ = *(undefined8 *)(A->x[0] + 2);
  local_78.x[1]._0_8_ = *(undefined8 *)A->x[1];
  local_78.x[1]._8_8_ = *(undefined8 *)(A->x[1] + 2);
  local_78.x[2]._0_8_ = *(undefined8 *)A->x[2];
  local_78.x[2]._8_8_ = *(undefined8 *)(A->x[2] + 2);
  local_78.x[3]._0_8_ = *(undefined8 *)A->x[3];
  local_78.x[3]._8_8_ = *(undefined8 *)(A->x[3] + 2);
  U->x[0][0] = 1.0;
  local_80 = U->x[0] + 1;
  *(float *)((long)(U->x + 0) + 4) = 0.0;
  *(float *)((long)(U->x + 0) + 8) = 0.0;
  *(undefined8 *)(U->x[0] + 3) = 0;
  U->x[1][1] = 1.0;
  *(float *)((long)(U->x + 1) + 8) = 0.0;
  *(float *)((long)(U->x + 1) + 0xc) = 0.0;
  *(float *)((long)(U->x + 2) + 0) = 0.0;
  *(float *)((long)(U->x + 2) + 4) = 0.0;
  U->x[2][2] = 1.0;
  *(undefined8 *)(U->x[2] + 3) = 0;
  *(float *)((long)(U->x + 3) + 4) = 0.0;
  *(float *)((long)(U->x + 3) + 8) = 0.0;
  U->x[3][3] = 1.0;
  V->x[0][0] = 1.0;
  local_88 = V->x[0] + 1;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(float *)((long)(V->x + 0) + 8) = 0.0;
  *(undefined8 *)(V->x[0] + 3) = 0;
  V->x[1][1] = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 1) + 0xc) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  *(undefined8 *)(V->x[2] + 3) = 0;
  *(float *)((long)(V->x + 3) + 4) = 0.0;
  *(float *)((long)(V->x + 3) + 8) = 0.0;
  V->x[3][3] = 1.0;
  fVar19 = 0.0;
  lVar8 = 0;
  do {
    lVar10 = 0;
    fVar17 = fVar19;
    do {
      fVar19 = fVar17;
      if ((lVar8 != lVar10) && (fVar19 = ABS((*(float (*) [4])*pafVar7)[lVar10]), fVar19 <= fVar17))
      {
        fVar19 = fVar17;
      }
      lVar10 = lVar10 + 1;
      fVar17 = fVar19;
    } while (lVar10 != 4);
    lVar8 = lVar8 + 1;
    pafVar7 = pafVar7 + 1;
  } while (lVar8 != 4);
  fVar19 = fVar19 * tol;
  if ((fVar19 != 0.0) || (NAN(fVar19))) {
    uVar16 = 0;
    while( true ) {
      bVar1 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,0,1,U,V,tol);
      bVar2 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,0,2,U,V,tol);
      bVar3 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,0,3,U,V,tol);
      bVar4 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,1,2,U,V,tol);
      bVar5 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,1,3,U,V,tol);
      bVar6 = anon_unknown_20::twoSidedJacobiRotation<float>(&local_78,2,3,U,V,tol);
      if (((((!bVar6) && (!bVar5)) && (!bVar4)) && ((!bVar3 && (!bVar1)))) && (!bVar2)) break;
      fVar17 = 0.0;
      pafVar7 = (float (*) [4])&local_78;
      lVar8 = 0;
      do {
        lVar10 = 0;
        fVar18 = fVar17;
        do {
          fVar17 = fVar18;
          if ((lVar8 != lVar10) &&
             (fVar17 = ABS((*(float (*) [4])*pafVar7)[lVar10]), fVar17 <= fVar18)) {
            fVar17 = fVar18;
          }
          lVar10 = lVar10 + 1;
          fVar18 = fVar17;
        } while (lVar10 != 4);
        lVar8 = lVar8 + 1;
        pafVar7 = pafVar7 + 1;
      } while (lVar8 != 4);
      if ((fVar17 <= fVar19) || (bVar1 = 0x12 < uVar16, uVar16 = uVar16 + 1, bVar1)) break;
    }
  }
  S->x = local_78.x[0][0];
  S->y = local_78.x[1][1];
  S->z = local_78.x[2][2];
  S->w = local_78.x[3][3];
  lVar8 = 0;
  pfVar9 = (float *)U;
  do {
    if ((&S->x)[lVar8] < 0.0) {
      (&S->x)[lVar8] = -(&S->x)[lVar8];
      lVar10 = 0;
      do {
        *(uint *)((long)pfVar9 + lVar10) = *(uint *)((long)pfVar9 + lVar10) ^ 0x80000000;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
    }
    lVar8 = lVar8 + 1;
    pfVar9 = pfVar9 + 1;
  } while (lVar8 != 4);
  lVar8 = 1;
  lVar10 = 0;
  pfVar9 = local_88;
  pfVar11 = local_80;
  do {
    local_98[0] = U->x[0][lVar8];
    local_98[1] = U->x[1][lVar8];
    local_98[2] = U->x[2][lVar8];
    local_98[3] = U->x[3][lVar8];
    local_a8[0] = V->x[0][lVar8];
    local_a8[1] = V->x[1][lVar8];
    local_a8[2] = V->x[2][lVar8];
    local_a8[3] = V->x[3][lVar8];
    fVar19 = (&S->x)[lVar8];
    lVar12 = lVar10;
    pfVar13 = pfVar9;
    pfVar14 = pfVar11;
    do {
      if (ABS(fVar19) <= ABS((&S->x)[lVar12])) goto LAB_001069cc;
      lVar15 = 0;
      do {
        *(undefined4 *)((long)pfVar14 + lVar15) = *(undefined4 *)((long)pfVar14 + lVar15 + -4);
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x40);
      lVar15 = 0;
      do {
        *(undefined4 *)((long)pfVar13 + lVar15) = *(undefined4 *)((long)pfVar13 + lVar15 + -4);
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x40);
      (&S->y)[lVar12] = (&S->x)[lVar12];
      pfVar14 = pfVar14 + -1;
      pfVar13 = pfVar13 + -1;
      bVar1 = 0 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar1);
    lVar12 = -1;
LAB_001069cc:
    lVar12 = (long)(int)lVar12;
    lVar15 = 0;
    do {
      local_80[lVar12 + lVar15] = *(float *)((long)local_98 + lVar15);
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x10);
    lVar15 = 0;
    do {
      local_88[lVar12 + lVar15] = *(float *)((long)local_a8 + lVar15);
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x10);
    (&S->y)[lVar12] = fVar19;
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 1;
    pfVar11 = pfVar11 + 1;
    pfVar9 = pfVar9 + 1;
    if (lVar10 == 3) {
      if (forcePositiveDeterminant) {
        fVar19 = Matrix44<float>::determinant(U);
        if (fVar19 < 0.0) {
          lVar8 = 0;
          do {
            *(uint *)((long)U->x[0] + lVar8 + 0xc) =
                 *(uint *)((long)U->x[0] + lVar8 + 0xc) ^ 0x80000000;
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x40);
          S->w = -S->w;
        }
        fVar19 = Matrix44<float>::determinant(V);
        if (fVar19 < 0.0) {
          lVar8 = 0;
          do {
            *(uint *)((long)V->x[0] + lVar8 + 0xc) =
                 *(uint *)((long)V->x[0] + lVar8 + 0xc) ^ 0x80000000;
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x40);
          S->w = -S->w;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}